

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::create_pipeline
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  void *__ptr;
  Allocator *pAVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  undefined4 *puVar10;
  int iVar11;
  char cVar12;
  int _w;
  ulong uVar13;
  Mat local_c8;
  Mat local_78;
  
  p_Var2 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  uVar13 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar1 = *(uint *)(&this->field_0x114 + (long)p_Var2);
  uVar7 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) / (long)(int)uVar1;
  _w = (int)uVar13;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)_w;
  if ((uVar1 == *(uint *)(&this->field_0xd0 + (long)p_Var2)) &&
     (uVar8 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                   (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var2) / (int)uVar1)) * uVar1,
     uVar8 == uVar1)) {
    cVar12 = '\x01';
    if (opt->use_packing_layout == true) {
      cVar12 = '\b';
      if ((uVar8 & 7) != 0) {
        cVar12 = ((uVar8 & 3) == 0) * '\x03' + '\x01';
      }
    }
    local_78.cstep = 0;
    local_78.data = (Allocator *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elempack = 0;
    local_78._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    iVar11 = 0;
    local_78.elemsize._4_4_ = (int)local_78.refcount;
    local_78.allocator = (Allocator *)local_78.data;
    local_78.dims = (int)local_78.refcount;
    local_78.w = local_78.refcount._4_4_;
    local_78.c = local_78.elempack;
    Mat::create(&local_78,
                *(int *)(&this->field_0x194 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]),
                4,(Allocator *)0x0);
    pp_Var3 = this->_vptr_DeconvolutionDepthWise_x86_avx;
    if (0 < (int)((uVar8 - (int)uVar8 % *(int *)(&this->field_0x114 + (long)pp_Var3[-3])) *
                 (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) /
                 *(int *)(&this->field_0x114 + (long)pp_Var3[-3])))) {
      lVar9 = *(long *)(&this->field_0x168 + (long)pp_Var3[-3]);
      puVar10 = (undefined4 *)((long)local_78.data + uVar13 * 4 + -4);
      do {
        if (0 < _w) {
          uVar7 = 0;
          puVar6 = puVar10;
          do {
            *puVar6 = *(undefined4 *)(lVar9 + uVar7 * 4);
            uVar7 = uVar7 + 1;
            puVar6 = puVar6 + -1;
          } while ((uVar13 & 0xffffffff) != uVar7);
        }
        iVar11 = iVar11 + 1;
        lVar9 = lVar9 + uVar13 * 4;
        puVar10 = puVar10 + uVar13;
      } while (iVar11 < (int)((uVar8 - (int)uVar8 % *(int *)(&this->field_0x114 + (long)pp_Var3[-3])
                              ) * (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) /
                                  *(int *)(&this->field_0x114 + (long)pp_Var3[-3]))));
    }
    if (cVar12 == '\x01') {
      if (&this->weight_data_tm != &local_78) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->weight_data_tm).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            __ptr = (this->weight_data_tm).data;
            pAVar5 = (this->weight_data_tm).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).data = local_78.data;
        (this->weight_data_tm).refcount =
             (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
        (this->weight_data_tm).elemsize =
             CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        (this->weight_data_tm).elempack = local_78.elempack;
        (this->weight_data_tm).allocator = local_78.allocator;
        (this->weight_data_tm).dims = local_78.dims;
        (this->weight_data_tm).w = local_78.w;
        (this->weight_data_tm).h = local_78.h;
        (this->weight_data_tm).d = local_78.d;
        (this->weight_data_tm).c = local_78.c;
        (this->weight_data_tm).cstep = local_78.cstep;
      }
    }
    else if (cVar12 == '\x04') {
      Mat::reshape(&local_c8,&local_78,_w,
                   *(int *)(&this->field_0x114 +
                           (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]),(Allocator *)0x0);
      convert_packing(&local_c8,&this->weight_data_tm,4,opt);
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (cVar12 == '\b') {
      Mat::reshape(&local_c8,&local_78,_w,*(int *)(&this->field_0x114 + (long)pp_Var3[-3]),
                   (Allocator *)0x0);
      convert_packing(&local_c8,&this->weight_data_tm,8,opt);
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_78.data != (Allocator *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    create_group_ops(this,opt);
    if (opt->lightmode == true) {
      p_Var2 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
      piVar4 = *(int **)(&this->field_0x170 + (long)p_Var2);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (*(long **)(&this->field_0x188 + (long)p_Var2) == (long *)0x0) {
            if (*(void **)(&this->field_0x168 + (long)p_Var2) != (void *)0x0) {
              free(*(void **)(&this->field_0x168 + (long)p_Var2));
            }
          }
          else {
            (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var2) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x1a8 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x174 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x17c + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x168 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x170 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
      *(undefined8 *)(&this->field_0x198 + (long)p_Var2) = 0;
      *(undefined4 *)(&this->field_0x1a0 + (long)p_Var2) = 0;
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}